

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int ixxx::posix::unlinkat(int __fd,char *__name,int __flag)

{
  int iVar1;
  unlinkat_error *this;
  int *piVar2;
  int r;
  int flags_local;
  char *pathname_local;
  int dirfd_local;
  
  iVar1 = ::unlinkat(__fd,__name,__flag);
  if (iVar1 == -1) {
    this = (unlinkat_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    unlinkat_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
    __cxa_throw(this,&unlinkat_error::typeinfo,unlinkat_error::~unlinkat_error);
  }
  return iVar1;
}

Assistant:

void unlinkat(int dirfd, const char *pathname, int flags)
    {
      int r = ::unlinkat(dirfd, pathname, flags);
      if (r == -1)
        throw unlinkat_error(errno);
    }